

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O3

bool __thiscall Assimp::TriangulateProcess::TriangulateMesh(TriangulateProcess *this,aiMesh *pMesh)

{
  float fVar1;
  char cVar2;
  aiVector3D *paVar3;
  aiFace *paVar4;
  aiFace *paVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  int iVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  bool bVar12;
  int iVar13;
  ulong *puVar14;
  aiFace *paVar15;
  aiFace *paVar16;
  void *pvVar17;
  float *pfVar18;
  uint *puVar19;
  uint *puVar20;
  Logger *this_00;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  char *pcVar24;
  char *pcVar25;
  aiFace *f;
  ulong uVar26;
  uint uVar27;
  aiVector3D *paVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar46;
  undefined1 auVar45 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> temp_verts;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp_verts3d;
  aiFace *local_f0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  long local_b0;
  aiFace *local_a8;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_a0;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  char *local_78;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_70;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar32 = pMesh->mPrimitiveTypes;
  if (uVar32 == 0) {
    uVar30 = (ulong)pMesh->mNumFaces;
    if (uVar30 != 0) {
      lVar29 = 0;
      bVar11 = 0;
      do {
        bVar9 = bVar11;
        bVar35 = *(int *)((long)&pMesh->mFaces->mNumIndices + lVar29) != 3;
        lVar29 = lVar29 + 0x10;
        bVar11 = bVar9 | bVar35;
      } while (uVar30 << 4 != lVar29);
      if ((bool)(bVar9 | bVar35)) goto LAB_0015fc41;
    }
  }
  else if ((uVar32 & 8) != 0) {
    uVar30 = (ulong)pMesh->mNumFaces;
LAB_0015fc41:
    if ((uint)uVar30 == 0) {
      uVar21 = 0;
      uVar31 = 0;
    }
    else {
      lVar29 = 0;
      uVar31 = 0;
      uVar21 = 0;
      do {
        uVar34 = *(uint *)((long)&pMesh->mFaces->mNumIndices + lVar29);
        if (uVar34 < 4) {
          uVar31 = uVar31 + 1;
          uVar34 = uVar21;
        }
        else {
          uVar31 = (uVar31 + uVar34) - 2;
          if (uVar34 < uVar21) {
            uVar34 = uVar21;
          }
        }
        uVar21 = uVar34;
        lVar29 = lVar29 + 0x10;
      } while (uVar30 << 4 != lVar29);
    }
    if (uVar31 == (uint)uVar30) {
      __assert_fail("numOut != pMesh->mNumFaces",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/TriangulateProcess.cpp"
                    ,0xa2,"bool Assimp::TriangulateProcess::TriangulateMesh(aiMesh *)");
    }
    pMesh->mPrimitiveTypes = uVar32 & 0xfffffff3 | 4;
    uVar30 = (ulong)uVar31;
    puVar14 = (ulong *)operator_new__(uVar30 * 0x10 + 8);
    *puVar14 = uVar30;
    paVar15 = (aiFace *)(puVar14 + 1);
    if (uVar31 != 0) {
      paVar16 = paVar15;
      do {
        paVar16->mNumIndices = 0;
        paVar16->mIndices = (uint *)0x0;
        paVar16 = paVar16 + 1;
      } while (paVar16 != paVar15 + uVar30);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              (&local_70,(ulong)(uVar21 + 2),(allocator_type *)&local_a0);
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::vector
              (&local_a0,(ulong)(uVar21 + 2),(allocator_type *)&local_c8);
    paVar3 = pMesh->mVertices;
    pvVar17 = operator_new__((ulong)uVar21);
    paVar16 = paVar15;
    if (pMesh->mNumFaces != 0) {
      local_78 = (char *)((long)pvVar17 + 2);
      uVar30 = 0;
      do {
        paVar4 = pMesh->mFaces;
        paVar5 = paVar4 + uVar30;
        uVar32 = paVar4[uVar30].mNumIndices;
        uVar26 = (ulong)(int)uVar32;
        if (uVar26 < 4) {
          paVar16->mNumIndices = uVar32;
          paVar16->mIndices = paVar5->mIndices;
          paVar5->mIndices = (uint *)0x0;
          paVar16 = paVar16 + 1;
        }
        else {
          local_a8 = paVar5;
          if (uVar32 == 4) {
            uVar26 = 0;
            do {
              puVar19 = paVar5->mIndices;
              if (uVar26 == 4) {
                uVar32 = 0;
                goto LAB_0016009b;
              }
              uVar21 = puVar19[(int)uVar26 - 1U & 3];
              uVar31 = puVar19[uVar26 ^ 2];
              uVar32 = (uint)(uVar26 + 1);
              uVar34 = puVar19[uVar32 & 3];
              uVar33 = puVar19[uVar26];
              fVar38 = paVar3[uVar33].x;
              fVar46 = paVar3[uVar33].y;
              fVar47 = paVar3[uVar33].z;
              fVar36 = paVar3[uVar34].x - fVar38;
              fVar39 = paVar3[uVar34].y - fVar46;
              fVar41 = paVar3[uVar34].z - fVar47;
              fVar40 = paVar3[uVar21].x - fVar38;
              local_48 = paVar3[uVar31].x - fVar38;
              fVar43 = paVar3[uVar21].y - fVar46;
              fVar44 = paVar3[uVar31].y - fVar46;
              fVar37 = paVar3[uVar21].z - fVar47;
              fStack_80 = paVar3[uVar31].z - fVar47;
              auVar48._0_4_ = fVar40 * fVar40 + fVar43 * fVar43;
              auVar48._4_4_ = local_48 * local_48 + fVar44 * fVar44;
              auVar48._8_4_ = (0.0 - fVar38) * (0.0 - fVar38) + (0.0 - fVar46) * (0.0 - fVar46);
              auVar48._12_4_ = (0.0 - fVar38) * (0.0 - fVar38) + (0.0 - fVar46) * (0.0 - fVar46);
              auVar45._0_4_ = fVar37 * fVar37 + auVar48._0_4_;
              auVar45._4_4_ = fStack_80 * fStack_80 + auVar48._4_4_;
              auVar45._8_4_ = (0.0 - fVar47) * (0.0 - fVar47) + auVar48._8_4_;
              auVar45._12_4_ = (0.0 - fVar47) * (0.0 - fVar47) + auVar48._12_4_;
              auVar49 = sqrtps(auVar48,auVar45);
              auVar49 = divps(_DAT_001ed870,auVar49);
              fVar38 = auVar49._0_4_;
              fVar46 = auVar49._4_4_;
              local_48 = local_48 * fVar46;
              fStack_80 = fStack_80 * fVar46;
              fVar46 = fVar46 * fVar44;
              local_88 = CONCAT44(fStack_80,fStack_80);
              fVar47 = 1.0 / SQRT(fVar41 * fVar41 + fVar36 * fVar36 + fVar39 * fVar39);
              local_b0 = CONCAT44(local_b0._4_4_,fVar39 * fVar47);
              local_58._4_4_ = fVar46;
              local_58._0_4_ = fVar46;
              local_58._8_4_ = fVar46;
              local_58._12_4_ = fVar46;
              fStack_7c = fStack_80;
              fStack_44 = local_48;
              fStack_40 = local_48;
              fStack_3c = local_48;
              fVar38 = acosf(fVar37 * fVar38 * fStack_80 +
                             fVar40 * fVar38 * local_48 + fVar38 * fVar43 * fVar46);
              fVar46 = acosf(fVar47 * fVar41 * (float)local_88 +
                             fVar36 * fVar47 * local_48 + (float)local_58._0_4_ * (float)local_b0);
              uVar26 = uVar26 + 1;
            } while (fVar46 + fVar38 <= 3.1415927);
            uVar32 = uVar32 - 1;
            puVar19 = paVar5->mIndices;
LAB_0016009b:
            local_c8 = *(undefined8 *)puVar19;
            uStack_c0 = *(undefined8 *)(puVar19 + 2);
            paVar16->mNumIndices = 3;
            puVar19 = paVar5->mIndices;
            paVar16->mIndices = puVar19;
            *puVar19 = *(uint *)((long)&local_c8 + (ulong)uVar32 * 4);
            paVar16->mIndices[1] = *(uint *)((long)&local_c8 + (ulong)(uVar32 + 1 & 3) * 4);
            paVar16->mIndices[2] = *(uint *)((long)&local_c8 + (ulong)(uVar32 ^ 2) * 4);
            paVar16[1].mNumIndices = 3;
            puVar19 = (uint *)operator_new__(0xc);
            paVar16[1].mIndices = puVar19;
            *puVar19 = *(uint *)((long)&local_c8 + (ulong)uVar32 * 4);
            paVar16[1].mIndices[1] = *(uint *)((long)&local_c8 + (ulong)(uVar32 ^ 2) * 4);
            paVar16[1].mIndices[2] = *(uint *)((long)&local_c8 + (ulong)(uVar32 - 1 & 3) * 4);
            paVar5->mIndices = (uint *)0x0;
            paVar16 = paVar16 + 2;
          }
          else {
            puVar19 = paVar4[uVar30].mIndices;
            if (0 < (int)uVar32) {
              lVar29 = 0;
              puVar20 = puVar19;
              do {
                uVar21 = *puVar20;
                *(float *)((long)&(local_70.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->z + lVar29) =
                     paVar3[uVar21].z;
                *(undefined8 *)
                 ((long)&(local_70.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar29) =
                     *(undefined8 *)(paVar3 + uVar21);
                puVar20 = puVar20 + 1;
                lVar29 = lVar29 + 0xc;
              } while (uVar26 * 0xc != lVar29);
            }
            iVar22 = uVar32 * 3 + 3;
            local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar26].x =
                 (local_70.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->x;
            (&(local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->x)[iVar22] =
                 local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].x;
            local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar26].y =
                 (local_70.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->y;
            (&(local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->y)[iVar22] =
                 local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].y;
            local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar26].z =
                 (local_70.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->z;
            (&(local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->z)[iVar22] =
                 local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].z;
            if ((int)uVar32 < 1) {
              fVar47 = 0.0;
              fVar38 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar46 = 0.0;
            }
            else {
              pfVar18 = &local_70.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[2].z;
              fVar47 = 0.0;
              fVar38 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar46 = 0.0;
              uVar21 = uVar32;
              do {
                fVar46 = fVar46 + (pfVar18[-1] - pfVar18[-7]) * pfVar18[-5];
                fVar47 = fVar47 + (*pfVar18 - pfVar18[-6]) * (float)*(undefined8 *)(pfVar18 + -4);
                fVar38 = fVar38 + (((aiVector3t<float> *)(pfVar18 + -2))->x - pfVar18[-8]) *
                                  (float)((ulong)*(undefined8 *)(pfVar18 + -4) >> 0x20);
                fVar36 = fVar36 + 0.0;
                fVar37 = fVar37 + 0.0;
                pfVar18 = pfVar18 + 3;
                uVar21 = uVar21 - 1;
              } while (uVar21 != 0);
            }
            auVar42._4_4_ = fVar38;
            auVar42._0_4_ = fVar47;
            auVar42._8_4_ = fVar36;
            auVar42._12_4_ = fVar37;
            auVar49._8_4_ = -fVar36;
            auVar49._0_8_ = CONCAT44(fVar38,fVar47) ^ 0x8000000080000000;
            auVar49._12_4_ = -fVar37;
            auVar49 = maxps(auVar42,auVar49);
            fVar36 = fVar46;
            if (fVar46 <= -fVar46) {
              fVar36 = -fVar46;
            }
            if (auVar49._0_4_ <= auVar49._4_4_) {
              if (auVar49._4_4_ <= fVar36) goto LAB_0016018a;
              iVar13 = 0;
              iVar22 = 2;
            }
            else if (fVar36 < auVar49._0_4_) {
              iVar13 = 2;
              iVar22 = 1;
              fVar38 = fVar47;
            }
            else {
LAB_0016018a:
              iVar13 = 1;
              iVar22 = 0;
              fVar38 = fVar46;
            }
            iVar8 = iVar13;
            if (fVar38 < 0.0) {
              iVar8 = iVar22;
              iVar22 = iVar13;
            }
            paVar5 = paVar16;
            if (0 < (int)uVar32) {
              uVar21 = uVar32 - 1;
              uVar23 = 0;
              do {
                paVar28 = paVar3 + puVar19[uVar23];
                if (iVar22 == 2) {
                  paVar28 = (aiVector3D *)&paVar28->z;
                }
                else if (iVar22 == 1) {
                  paVar28 = (aiVector3D *)&paVar28->y;
                }
                local_a0.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar23].x = paVar28->x;
                paVar28 = paVar3 + puVar19[uVar23];
                if (iVar8 == 2) {
                  paVar28 = (aiVector3D *)&paVar28->z;
                }
                else if (iVar8 == 1) {
                  paVar28 = (aiVector3D *)&paVar28->y;
                }
                local_a0.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar23].y = paVar28->x;
                *(undefined1 *)((long)pvVar17 + uVar23) = 0;
                uVar23 = uVar23 + 1;
              } while (uVar26 != uVar23);
              if (3 < (int)uVar32) {
                uVar34 = 0;
                uVar31 = uVar32;
                local_f0 = paVar16;
LAB_0016024c:
                local_88 = (ulong)uVar31;
                bVar35 = false;
                uVar31 = uVar21;
LAB_00160258:
                while( true ) {
                  uVar33 = uVar34;
                  uVar21 = uVar31;
                  uVar34 = uVar33;
                  do {
                    uVar34 = uVar34 + 1;
                    if ((int)uVar32 <= (int)uVar34) {
                      uVar34 = 0;
                    }
                    lVar29 = (long)(int)uVar34;
                  } while (*(char *)((long)pvVar17 + lVar29) != '\0');
                  bVar12 = bVar35;
                  if (((int)uVar34 < (int)uVar33) && (bVar12 = true, bVar35)) break;
                  bVar35 = bVar12;
                  local_b0 = (long)(int)uVar33;
                  fVar38 = local_a0.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)uVar21].x;
                  fVar46 = local_a0.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)uVar21].y;
                  fVar47 = local_a0.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar29].x;
                  fVar36 = local_a0.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar29].y;
                  fVar37 = local_a0.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_b0].x;
                  fVar39 = local_a0.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_b0].y;
                  uVar31 = uVar33;
                  if ((fVar47 * (fVar39 - fVar46) +
                      (fVar46 - fVar36) * fVar37 + (fVar36 - fVar39) * fVar38) * 0.5 <= 0.0) {
                    fVar41 = fVar37 - fVar38;
                    fVar43 = fVar47 - fVar38;
                    fVar44 = fVar39 - fVar46;
                    fVar50 = fVar36 - fVar46;
                    fVar51 = fVar43 * fVar41 + fVar50 * fVar44;
                    fVar52 = fVar41 * fVar41 + fVar44 * fVar44;
                    fVar53 = fVar43 * fVar43 + fVar50 * fVar50;
                    fVar40 = 1.0 / (fVar53 * fVar52 - fVar51 * fVar51);
                    uVar23 = 0;
                    uVar27 = uVar33;
                    do {
                      fVar55 = local_a0.
                               super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar23].x;
                      fVar1 = local_a0.
                              super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar23].y;
                      if ((fVar55 != fVar37) || (NAN(fVar55) || NAN(fVar37))) {
LAB_001603f1:
                        if ((fVar55 == fVar47) && (!NAN(fVar55) && !NAN(fVar47))) {
                          if ((fVar1 == fVar36) && (!NAN(fVar1) && !NAN(fVar36))) goto LAB_0016048c;
                        }
                        if ((fVar55 == fVar38) && (!NAN(fVar55) && !NAN(fVar38))) {
                          if ((fVar1 == fVar46) && (!NAN(fVar1) && !NAN(fVar46))) goto LAB_0016048c;
                        }
                        fVar54 = (fVar55 - fVar38) * fVar41 + (fVar1 - fVar46) * fVar44;
                        fVar55 = (fVar55 - fVar38) * fVar43 + (fVar1 - fVar46) * fVar50;
                        fVar1 = (fVar55 * -fVar51 + fVar53 * fVar54) * fVar40;
                        fVar55 = (fVar54 * -fVar51 + fVar52 * fVar55) * fVar40;
                        lVar29 = -(ulong)(0.0 < fVar55);
                        auVar7._8_4_ = (int)lVar29;
                        auVar7._0_8_ = -(ulong)(0.0 < fVar1);
                        auVar7._12_4_ = (int)((ulong)lVar29 >> 0x20);
                        uVar27 = movmskpd(uVar27,auVar7);
                        if ((uVar27 == 3) && (fVar55 + fVar1 < 1.0)) goto LAB_0016049a;
                      }
                      else if ((fVar1 != fVar39) || (NAN(fVar1) || NAN(fVar39))) goto LAB_001603f1;
LAB_0016048c:
                      uVar23 = uVar23 + 1;
                      if (uVar26 == uVar23) goto LAB_001604a5;
                    } while( true );
                  }
                }
                this_00 = DefaultLogger::get();
                Logger::error(this_00,
                              "Failed to triangulate polygon (no ear found). Probably not a simple polygon?"
                             );
                paVar16 = local_f0;
                goto joined_r0x001605b9;
              }
LAB_00160506:
              paVar16->mNumIndices = 3;
              puVar20 = paVar16->mIndices;
              if (puVar20 == (uint *)0x0) {
                puVar20 = (uint *)operator_new__(0xc);
                paVar16->mIndices = puVar20;
              }
              lVar29 = -1;
              pcVar25 = local_78;
              uVar26 = 1;
              do {
                uVar23 = uVar26;
                pcVar24 = pcVar25;
                lVar10 = lVar29 + 1;
                lVar29 = lVar29 + 1;
                pcVar25 = pcVar24 + 1;
                uVar26 = uVar23 + 1;
              } while (*(char *)((long)pvVar17 + lVar10) != '\0');
              *puVar20 = (uint)lVar29;
              do {
                pcVar25 = pcVar24;
                uVar26 = uVar23;
                uVar23 = uVar26 + 1;
                pcVar24 = pcVar25 + 1;
              } while (*(char *)((long)pvVar17 + uVar26) != '\0');
              paVar16->mIndices[1] = (int)(uVar26 + 1) - 1;
              do {
                uVar32 = (int)uVar26 + 1;
                uVar26 = (ulong)uVar32;
                cVar2 = *pcVar25;
                pcVar25 = pcVar25 + 1;
              } while (cVar2 != '\0');
              paVar16->mIndices[2] = uVar32;
              paVar16 = paVar16 + 1;
            }
joined_r0x001605b9:
            for (; paVar4 = local_a8, paVar5 != paVar16; paVar5 = paVar5 + 1) {
              puVar20 = paVar5->mIndices;
              *puVar20 = puVar19[*puVar20];
              puVar20[1] = puVar19[puVar20[1]];
              puVar20[2] = puVar19[puVar20[2]];
            }
            if (local_a8->mIndices != (uint *)0x0) {
              operator_delete__(local_a8->mIndices);
            }
            paVar4->mIndices = (uint *)0x0;
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 < pMesh->mNumFaces);
    }
    paVar5 = pMesh->mFaces;
    if (paVar5 != (aiFace *)0x0) {
      if (paVar5[-1].mIndices != (uint *)0x0) {
        lVar29 = (long)paVar5[-1].mIndices << 4;
        do {
          pvVar6 = *(void **)((long)&paVar5[-1].mIndices + lVar29);
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
          }
          lVar29 = lVar29 + -0x10;
        } while (lVar29 != 0);
      }
      operator_delete__(&paVar5[-1].mIndices);
    }
    pMesh->mFaces = paVar15;
    pMesh->mNumFaces = (uint)((ulong)((long)paVar16 - (long)paVar15) >> 4);
    operator_delete__(pvVar17);
    if (local_a0.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return true;
  }
  return false;
LAB_0016049a:
  if (uVar32 == (uint)uVar23) goto LAB_001604a5;
  goto LAB_00160258;
LAB_001604a5:
  local_f0->mNumIndices = 3;
  puVar20 = local_f0->mIndices;
  if (puVar20 == (uint *)0x0) {
    puVar20 = (uint *)operator_new__(0xc);
    local_f0->mIndices = puVar20;
  }
  paVar16 = local_f0 + 1;
  *puVar20 = uVar21;
  local_f0->mIndices[1] = uVar33;
  local_f0->mIndices[2] = uVar34;
  *(undefined1 *)((long)pvVar17 + local_b0) = 1;
  uVar31 = (int)local_88 - 1;
  local_f0 = paVar16;
  if ((int)local_88 < 5) goto LAB_00160506;
  goto LAB_0016024c;
}

Assistant:

bool TriangulateProcess::TriangulateMesh( aiMesh* pMesh)
{
    // Now we have aiMesh::mPrimitiveTypes, so this is only here for test cases
    if (!pMesh->mPrimitiveTypes)    {
        bool bNeed = false;

        for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
            const aiFace& face = pMesh->mFaces[a];

            if( face.mNumIndices != 3)  {
                bNeed = true;
            }
        }
        if (!bNeed)
            return false;
    }
    else if (!(pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON)) {
        return false;
    }

    // Find out how many output faces we'll get
    unsigned int numOut = 0, max_out = 0;
    bool get_normals = true;
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices <= 4) {
            get_normals = false;
        }
        if( face.mNumIndices <= 3) {
            numOut++;

        }
        else {
            numOut += face.mNumIndices-2;
            max_out = std::max(max_out,face.mNumIndices);
        }
    }

    // Just another check whether aiMesh::mPrimitiveTypes is correct
    ai_assert(numOut != pMesh->mNumFaces);

    aiVector3D* nor_out = NULL;

    // if we don't have normals yet, but expect them to be a cheap side
    // product of triangulation anyway, allocate storage for them.
    if (!pMesh->mNormals && get_normals) {
        // XXX need a mechanism to inform the GenVertexNormals process to treat these normals as preprocessed per-face normals
    //  nor_out = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    }

    // the output mesh will contain triangles, but no polys anymore
    pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
    pMesh->mPrimitiveTypes &= ~aiPrimitiveType_POLYGON;

    aiFace* out = new aiFace[numOut](), *curOut = out;
    std::vector<aiVector3D> temp_verts3d(max_out+2); /* temporary storage for vertices */
    std::vector<aiVector2D> temp_verts(max_out+2);

    // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
    if (!pMesh->mColors[0])
        pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
    else
        new(pMesh->mColors[0]) aiColor4D[pMesh->mNumVertices];

    aiColor4D* clr = pMesh->mColors[0];
#endif

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    FILE* fout = fopen(POLY_OUTPUT_FILE,"a");
#endif

    const aiVector3D* verts = pMesh->mVertices;

    // use std::unique_ptr to avoid slow std::vector<bool> specialiations
    std::unique_ptr<bool[]> done(new bool[max_out]);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];

        unsigned int* idx = face.mIndices;
        int num = (int)face.mNumIndices, ear = 0, tmp, prev = num-1, next = 0, max = num;

        // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            aiColor4D& c = clr[idx[i]];
            c.r = (i+1) / (float)max;
            c.b = 1.f - c.r;
        }
#endif

        aiFace* const last_face = curOut;

        // if it's a simple point,line or triangle: just copy it
        if( face.mNumIndices <= 3)
        {
            aiFace& nface = *curOut++;
            nface.mNumIndices = face.mNumIndices;
            nface.mIndices    = face.mIndices;

            face.mIndices = NULL;
            continue;
        }
        // optimized code for quadrilaterals
        else if ( face.mNumIndices == 4) {

            // quads can have at maximum one concave vertex. Determine
            // this vertex (if it exists) and start tri-fanning from
            // it.
            unsigned int start_vertex = 0;
            for (unsigned int i = 0; i < 4; ++i) {
                const aiVector3D& v0 = verts[face.mIndices[(i+3) % 4]];
                const aiVector3D& v1 = verts[face.mIndices[(i+2) % 4]];
                const aiVector3D& v2 = verts[face.mIndices[(i+1) % 4]];

                const aiVector3D& v = verts[face.mIndices[i]];

                aiVector3D left = (v0-v);
                aiVector3D diag = (v1-v);
                aiVector3D right = (v2-v);

                left.Normalize();
                diag.Normalize();
                right.Normalize();

                const float angle = std::acos(left*diag) + std::acos(right*diag);
                if (angle > AI_MATH_PI_F) {
                    // this is the concave point
                    start_vertex = i;
                    break;
                }
            }

            const unsigned int temp[] = {face.mIndices[0], face.mIndices[1], face.mIndices[2], face.mIndices[3]};

            aiFace& nface = *curOut++;
            nface.mNumIndices = 3;
            nface.mIndices = face.mIndices;

            nface.mIndices[0] = temp[start_vertex];
            nface.mIndices[1] = temp[(start_vertex + 1) % 4];
            nface.mIndices[2] = temp[(start_vertex + 2) % 4];

            aiFace& sface = *curOut++;
            sface.mNumIndices = 3;
            sface.mIndices = new unsigned int[3];

            sface.mIndices[0] = temp[start_vertex];
            sface.mIndices[1] = temp[(start_vertex + 2) % 4];
            sface.mIndices[2] = temp[(start_vertex + 3) % 4];

            // prevent double deletion of the indices field
            face.mIndices = NULL;
            continue;
        }
        else
        {
            // A polygon with more than 3 vertices can be either concave or convex.
            // Usually everything we're getting is convex and we could easily
            // triangulate by tri-fanning. However, LightWave is probably the only
            // modeling suite to make extensive use of highly concave, monster polygons ...
            // so we need to apply the full 'ear cutting' algorithm to get it right.

            // RERQUIREMENT: polygon is expected to be simple and *nearly* planar.
            // We project it onto a plane to get a 2d triangle.

            // Collect all vertices of of the polygon.
           for (tmp = 0; tmp < max; ++tmp) {
                temp_verts3d[tmp] = verts[idx[tmp]];
            }

            // Get newell normal of the polygon. Store it for future use if it's a polygon-only mesh
            aiVector3D n;
            NewellNormal<3,3,3>(n,max,&temp_verts3d.front().x,&temp_verts3d.front().y,&temp_verts3d.front().z);
            if (nor_out) {
                 for (tmp = 0; tmp < max; ++tmp)
                     nor_out[idx[tmp]] = n;
            }

            // Select largest normal coordinate to ignore for projection
            const float ax = (n.x>0 ? n.x : -n.x);
            const float ay = (n.y>0 ? n.y : -n.y);
            const float az = (n.z>0 ? n.z : -n.z);

            unsigned int ac = 0, bc = 1; /* no z coord. projection to xy */
            float inv = n.z;
            if (ax > ay) {
                if (ax > az) { /* no x coord. projection to yz */
                    ac = 1; bc = 2;
                    inv = n.x;
                }
            }
            else if (ay > az) { /* no y coord. projection to zy */
                ac = 2; bc = 0;
                inv = n.y;
            }

            // Swap projection axes to take the negated projection vector into account
            if (inv < 0.f) {
                std::swap(ac,bc);
            }

            for (tmp =0; tmp < max; ++tmp) {
                temp_verts[tmp].x = verts[idx[tmp]][ac];
                temp_verts[tmp].y = verts[idx[tmp]][bc];
                done[tmp] = false;
            }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
            // plot the plane onto which we mapped the polygon to a 2D ASCII pic
            aiVector2D bmin,bmax;
            ArrayBounds(&temp_verts[0],max,bmin,bmax);

            char grid[POLY_GRID_Y][POLY_GRID_X+POLY_GRID_XPAD];
            std::fill_n((char*)grid,POLY_GRID_Y*(POLY_GRID_X+POLY_GRID_XPAD),' ');

            for (int i =0; i < max; ++i) {
                const aiVector2D& v = (temp_verts[i] - bmin) / (bmax-bmin);
                const size_t x = static_cast<size_t>(v.x*(POLY_GRID_X-1)), y = static_cast<size_t>(v.y*(POLY_GRID_Y-1));
                char* loc = grid[y]+x;
                if (grid[y][x] != ' ') {
                    for(;*loc != ' '; ++loc);
                    *loc++ = '_';
                }
                *(loc+::ai_snprintf(loc, POLY_GRID_XPAD,"%i",i)) = ' ';
            }


            for(size_t y = 0; y < POLY_GRID_Y; ++y) {
                grid[y][POLY_GRID_X+POLY_GRID_XPAD-1] = '\0';
                fprintf(fout,"%s\n",grid[y]);
            }

            fprintf(fout,"\ntriangulation sequence: ");
#endif

            //
            // FIXME: currently this is the slow O(kn) variant with a worst case
            // complexity of O(n^2) (I think). Can be done in O(n).
            while (num > 3) {

                // Find the next ear of the polygon
                int num_found = 0;
                for (ear = next;;prev = ear,ear = next) {

                    // break after we looped two times without a positive match
                    for (next=ear+1;done[(next>=max?next=0:next)];++next);
                    if (next < ear) {
                        if (++num_found == 2) {
                            break;
                        }
                    }
                    const aiVector2D* pnt1 = &temp_verts[ear],
                        *pnt0 = &temp_verts[prev],
                        *pnt2 = &temp_verts[next];

                    // Must be a convex point. Assuming ccw winding, it must be on the right of the line between p-1 and p+1.
                    if (OnLeftSideOfLine2D(*pnt0,*pnt2,*pnt1)) {
                        continue;
                    }

                    // and no other point may be contained in this triangle
                    for ( tmp = 0; tmp < max; ++tmp) {

                        // We need to compare the actual values because it's possible that multiple indexes in
                        // the polygon are referring to the same position. concave_polygon.obj is a sample
                        //
                        // FIXME: Use 'epsiloned' comparisons instead? Due to numeric inaccuracies in
                        // PointInTriangle() I'm guessing that it's actually possible to construct
                        // input data that would cause us to end up with no ears. The problem is,
                        // which epsilon? If we chose a too large value, we'd get wrong results
                        const aiVector2D& vtmp = temp_verts[tmp];
                        if ( vtmp != *pnt1 && vtmp != *pnt2 && vtmp != *pnt0 && PointInTriangle2D(*pnt0,*pnt1,*pnt2,vtmp)) {
                            break;
                        }
                    }
                    if (tmp != max) {
                        continue;
                    }

                    // this vertex is an ear
                    break;
                }
                if (num_found == 2) {

                    // Due to the 'two ear theorem', every simple polygon with more than three points must
                    // have 2 'ears'. Here's definitely something wrong ... but we don't give up yet.
                    //

                    // Instead we're continuing with the standard tri-fanning algorithm which we'd
                    // use if we had only convex polygons. That's life.
                    ASSIMP_LOG_ERROR("Failed to triangulate polygon (no ear found). Probably not a simple polygon?");

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
                    fprintf(fout,"critical error here, no ear found! ");
#endif
                    num = 0;
                    break;

                    curOut -= (max-num); /* undo all previous work */
                    for (tmp = 0; tmp < max-2; ++tmp) {
                        aiFace& nface = *curOut++;

                        nface.mNumIndices = 3;
                        if (!nface.mIndices)
                            nface.mIndices = new unsigned int[3];

                        nface.mIndices[0] = 0;
                        nface.mIndices[1] = tmp+1;
                        nface.mIndices[2] = tmp+2;

                    }
                    num = 0;
                    break;
                }

                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;

                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                // setup indices for the new triangle ...
                nface.mIndices[0] = prev;
                nface.mIndices[1] = ear;
                nface.mIndices[2] = next;

                // exclude the ear from most further processing
                done[ear] = true;
                --num;
            }
            if (num > 0) {
                // We have three indices forming the last 'ear' remaining. Collect them.
                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;
                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                for (tmp = 0; done[tmp]; ++tmp);
                nface.mIndices[0] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[1] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[2] = tmp;

            }
        }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS

        for(aiFace* f = last_face; f != curOut; ++f) {
            unsigned int* i = f->mIndices;
            fprintf(fout," (%i %i %i)",i[0],i[1],i[2]);
        }

        fprintf(fout,"\n*********************************************************************\n");
        fflush(fout);

#endif

        for(aiFace* f = last_face; f != curOut; ) {
            unsigned int* i = f->mIndices;

            //  drop dumb 0-area triangles - deactivated for now:
            //FindDegenerates post processing step can do the same thing
            //if (std::fabs(GetArea2D(temp_verts[i[0]],temp_verts[i[1]],temp_verts[i[2]])) < 1e-5f) {
            //    ASSIMP_LOG_DEBUG("Dropping triangle with area 0");
            //    --curOut;

            //    delete[] f->mIndices;
            //    f->mIndices = nullptr;

            //    for(aiFace* ff = f; ff != curOut; ++ff) {
            //        ff->mNumIndices = (ff+1)->mNumIndices;
            //        ff->mIndices = (ff+1)->mIndices;
            //        (ff+1)->mIndices = nullptr;
            //    }
            //    continue;
            //}

            i[0] = idx[i[0]];
            i[1] = idx[i[1]];
            i[2] = idx[i[2]];
            ++f;
        }

        delete[] face.mIndices;
        face.mIndices = NULL;
    }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    fclose(fout);
#endif

    // kill the old faces
    delete [] pMesh->mFaces;

    // ... and store the new ones
    pMesh->mFaces    = out;
    pMesh->mNumFaces = (unsigned int)(curOut-out); /* not necessarily equal to numOut */
    return true;
}